

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlsxio_csv2xlsx.c
# Opt level: O0

int append_buffer_data(char **pdata,size_t *pdatalen,char *bufferdata,size_t bufferdatalen)

{
  char *pcVar1;
  size_t bufferdatalen_local;
  char *bufferdata_local;
  size_t *pdatalen_local;
  char **pdata_local;
  
  pcVar1 = (char *)realloc(*pdata,*pdatalen + bufferdatalen + 1);
  *pdata = pcVar1;
  if (pcVar1 != (char *)0x0) {
    memcpy(*pdata + *pdatalen,bufferdata,bufferdatalen);
    *pdatalen = bufferdatalen + *pdatalen;
  }
  else {
    *pdatalen = 0;
  }
  pdata_local._4_4_ = (uint)(pcVar1 == (char *)0x0);
  return pdata_local._4_4_;
}

Assistant:

int append_buffer_data (char** pdata, size_t* pdatalen, const char* bufferdata, size_t bufferdatalen)
{
  //allocate larger data buffer, abort in case of memory allocation error
  if ((*pdata = (char*)realloc(*pdata, *pdatalen + bufferdatalen + 1)) == NULL) {
    //memory allocation error
    *pdatalen = 0;
    return 1;
  }
  //append new data and adjust length
  memcpy(*pdata + *pdatalen, bufferdata, bufferdatalen);
  *pdatalen += bufferdatalen;
  return 0;
}